

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O1

uint32 rw::wdgl::skinInstanceCB(Geometry *g,int32 i,uint32 offset)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  uint uVar3;
  InstanceDataHeader *pIVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint32 uVar8;
  long lVar9;
  float32 *src;
  AttribDesc *a;
  
  pIVar4 = g->instData;
  lVar9 = *(long *)(pIVar4 + 2);
  lVar6 = (long)i;
  puVar1 = (undefined8 *)(lVar9 + lVar6 * 0x18);
  *puVar1 = 0x200000004;
  puVar1[1] = 0x400000001;
  *(uint32 *)(lVar9 + 0x14 + lVar6 * 0x18) = offset;
  puVar2 = (undefined4 *)(lVar9 + 0x18 + lVar6 * 0x18);
  *puVar2 = 5;
  puVar2[1] = 2;
  puVar2[2] = 0;
  puVar2[3] = 4;
  *(uint32 *)(lVar9 + 0x2c + lVar6 * 0x18) = offset + 4;
  uVar8 = g->numVertices * (offset + 8);
  pIVar4[4].platform = uVar8;
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/gl/wdgl.cpp line: 617"
  ;
  lVar5 = (*DAT_00148858)(uVar8,0x3000f);
  *(long *)(pIVar4 + 6) = lVar5;
  lVar9 = *(long *)((long)g->texCoords + (long)skinGlobals + -0x38);
  if ((lVar9 != 0) && (0 < g->numVertices)) {
    a = (AttribDesc *)(lVar6 * 0x18 + *(long *)(pIVar4 + 2));
    lVar6 = *(long *)(lVar9 + 0x20);
    src = *(float32 **)(lVar9 + 0x28);
    uVar3 = a->offset;
    uVar7 = (ulong)a[1].offset;
    lVar9 = 0;
    do {
      packattrib((uint8 *)(lVar5 + (ulong)uVar3),src,a,1.0);
      src = src + 4;
      *(undefined1 *)(lVar5 + uVar7) = *(undefined1 *)(lVar6 + lVar9 * 4);
      *(undefined1 *)(lVar5 + 1 + uVar7) = *(undefined1 *)(lVar6 + 1 + lVar9 * 4);
      *(undefined1 *)(lVar5 + 2 + uVar7) = *(undefined1 *)(lVar6 + 2 + lVar9 * 4);
      *(undefined1 *)(lVar5 + 3 + uVar7) = *(undefined1 *)(lVar6 + 3 + lVar9 * 4);
      lVar9 = lVar9 + 1;
      lVar5 = lVar5 + (ulong)(offset + 8);
    } while ((int)lVar9 < g->numVertices);
  }
  return 8;
}

Assistant:

uint32
skinInstanceCB(Geometry *g, int32 i, uint32 offset)
{
	InstanceDataHeader *header = (InstanceDataHeader*)g->instData;
	AttribDesc *a = &header->attribs[i];
	// weights
	a->index = 4;
	a->type = 2;	/* but also short o_O */
	a->normalized = 1;
	a->size = 4;
	a->offset = offset;
	offset += 4;
	a++;

	// indices
	a->index = 5;
	a->type = 2;
	a->normalized = 0;
	a->size = 4;
	a->offset = offset;
	offset += 4;

	header->dataSize = offset*g->numVertices;
	header->data = rwNewT(uint8, header->dataSize, MEMDUR_EVENT | ID_GEOMETRY);

	Skin *skin = Skin::get(g);
	if(skin == nil)
		return 8;

	a = &header->attribs[i];
	uint8 *wgt = header->data + a[0].offset;
	uint8 *idx = header->data + a[1].offset;
	uint8 *indices = skin->indices;
	float32 *weights = skin->weights;
	for(int32 i = 0; i < g->numVertices; i++){
		packattrib(wgt, weights, a);
		weights += 4;
		wgt += offset;
		idx[0] = *indices++;
		idx[1] = *indices++;
		idx[2] = *indices++;
		idx[3] = *indices++;
		idx += offset;
	}

	return 8;
}